

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O0

void __thiscall correctness_div_return_value_Test::TestBody(correctness_div_return_value_Test *this)

{
  undefined1 uVar1;
  big_integer *expected;
  AssertionResult gtest_ar;
  big_integer b;
  big_integer a;
  big_integer *in_stack_000000e8;
  big_integer *in_stack_000000f0;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  undefined8 in_stack_ffffffffffffff48;
  int a_00;
  big_integer *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 uVar2;
  Type in_stack_ffffffffffffff6c;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff70;
  Message *in_stack_ffffffffffffffb8;
  AssertHelper *in_stack_ffffffffffffffc0;
  
  a_00 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  big_integer::big_integer(in_stack_ffffffffffffff50,a_00);
  big_integer::big_integer(in_stack_ffffffffffffff50,a_00);
  expected = big_integer::operator/=(in_stack_000000f0,in_stack_000000e8);
  big_integer::operator/=(in_stack_000000f0,in_stack_000000e8);
  uVar2 = 0x19;
  testing::internal::EqHelper<false>::Compare<big_integer,int>
            ((char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             &in_stack_ffffffffffffff50->sign,expected,
             (int *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  uVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff68);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff70.ptr_);
    testing::AssertionResult::failure_message((AssertionResult *)0x119a99);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffff70.ptr_,in_stack_ffffffffffffff6c,
               (char *)CONCAT44(uVar2,in_stack_ffffffffffffff60),in_stack_ffffffffffffff5c,
               &in_stack_ffffffffffffff50->sign);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff40));
    testing::Message::~Message((Message *)0x119ae5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x119b25);
  big_integer::~big_integer((big_integer *)CONCAT17(uVar1,in_stack_ffffffffffffff40));
  big_integer::~big_integer((big_integer *)CONCAT17(uVar1,in_stack_ffffffffffffff40));
  return;
}

Assistant:

TEST(correctness, div_return_value)
{
    big_integer a = 100;
    big_integer b = 2;

    (a /= b) /= b;
    EXPECT_EQ(a, 25);
}